

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void __thiscall
HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
::HashTable(HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
            *this)

{
  int iVar1;
  undefined8 *puVar2;
  int i;
  long lVar3;
  long lVar4;
  TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
  TStack_d8;
  
  lVar3 = 8;
  this->capacity = 8;
  this->size = 0;
  this->PRIME = 7;
  puVar2 = (undefined8 *)operator_new__(0x5c8);
  *puVar2 = 8;
  do {
    TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
    ::TableItems((TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
                  *)((long)puVar2 + lVar3));
    lVar3 = lVar3 + 0xb8;
  } while (lVar3 != 0x5c8);
  this->table = (TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
                 *)(puVar2 + 1);
  iVar1 = lablnet::findLeastPrime((int)this->capacity);
  this->PRIME = iVar1;
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < this->capacity; lVar3 = lVar3 + 1) {
    memset(&TStack_d8,0,0xb8);
    TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
    ::TableItems(&TStack_d8);
    TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
    ::operator=((TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
                 *)((long)&(this->table->key)._M_dataplus._M_p + lVar4),&TStack_d8);
    TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
    ::~TableItems(&TStack_d8);
    lVar4 = lVar4 + 0xb8;
  }
  return;
}

Assistant:

HashTable() {
        this->table = new TableItems<K, V>[capacity];
        this->PRIME = lablnet::findLeastPrime(this->capacity);
        for (int i = 0; i< this->capacity; i++) {
            this->table[i] = TableItems<K, V>();
        }
    }